

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parcor_coefficients_to_linear_predictive_coefficients.cc
# Opt level: O2

bool __thiscall
sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
          (ParcorCoefficientsToLinearPredictiveCoefficients *this,
          vector<double,_std::allocator<double>_> *parcor_coefficients,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,Buffer *buffer)

{
  pointer pdVar1;
  long lVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  bool bVar6;
  size_type __new_size;
  double *__src;
  long lVar7;
  long lVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> *this_00;
  
  if (this->is_valid_ == true) {
    bVar6 = false;
    if ((buffer != (Buffer *)0x0) &&
       (bVar6 = false,
       linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0)) {
      iVar4 = this->num_order_;
      lVar2 = (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      __new_size = lVar2 >> 3;
      if (__new_size == (long)iVar4 + 1U) {
        if ((long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start != lVar2) {
          std::vector<double,_std::allocator<double>_>::resize
                    (linear_predictive_coefficients,__new_size);
          iVar4 = this->num_order_;
        }
        this_00 = &buffer->a_;
        if ((long)(buffer->a_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->a_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != (long)iVar4) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar4);
          iVar4 = this->num_order_;
        }
        __src = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
        pdVar3 = (linear_predictive_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar3 = *__src;
        bVar6 = true;
        if (iVar4 != 0) {
          __n = (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish + (-8 - (long)__src);
          if (__n != 0) {
            memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,__src,__n);
            __src = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (linear_predictive_coefficients->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4 = this->num_order_;
          }
          pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = (long)iVar4;
          lVar7 = 1;
          for (lVar2 = 2; lVar8 = 1, lVar9 = lVar7, lVar2 <= lVar5; lVar2 = lVar2 + 1) {
            while (lVar9 != 0) {
              pdVar3[lVar8] = __src[lVar2] * pdVar1[lVar9] + pdVar1[lVar8];
              lVar8 = lVar8 + 1;
              lVar9 = lVar9 + -1;
            }
            for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
              pdVar1[lVar8 + 1] = pdVar3[lVar8 + 1];
            }
            lVar7 = lVar7 + 1;
          }
          pdVar3[lVar5] = __src[lVar5];
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ParcorCoefficientsToLinearPredictiveCoefficients::Run(
    const std::vector<double>& parcor_coefficients,
    std::vector<double>* linear_predictive_coefficients,
    ParcorCoefficientsToLinearPredictiveCoefficients::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      parcor_coefficients.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->a_.size() != static_cast<std::size_t>(num_order_)) {
    buffer->a_.resize(num_order_);
  }

  // Copy gain.
  (*linear_predictive_coefficients)[0] = parcor_coefficients[0];
  if (0 == num_order_) {
    return true;
  }

  // Set initial condition.
  std::copy(parcor_coefficients.begin(), parcor_coefficients.end() - 1,
            buffer->a_.begin());

  // Apply recursive formula.
  const double* k(&(parcor_coefficients[0]));
  double* prev_a(&buffer->a_[0]);
  double* a(&((*linear_predictive_coefficients)[0]));
  for (int i(2); i <= num_order_; ++i) {
    for (int m(1); m < i; ++m) {
      a[m] = prev_a[m] + k[i] * prev_a[i - m];
    }
    for (int m(1); m < i; ++m) {
      prev_a[m] = a[m];
    }
  }
  a[num_order_] = k[num_order_];

  return true;
}